

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalObject.cpp
# Opt level: O0

JsrtExternalObject *
JsrtExternalObject::Create
          (void *data,uint inlineSlotSize,JsTraceCallback traceCallback,
          JsFinalizeCallback finalizeCallback,RecyclableObject *prototype,
          ScriptContext *scriptContext,JsrtExternalType *type)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  JavascriptLibrary *pJVar4;
  Recycler *pRVar5;
  undefined4 *puVar6;
  JsrtExternalObject *pJVar7;
  TrackAllocData local_110;
  code *local_e8;
  undefined8 local_e0;
  TrackAllocData local_d8;
  code *local_b0;
  undefined8 local_a8;
  TrackAllocData local_a0;
  JsrtExternalObject *local_78;
  JsrtExternalObject *externalObject;
  undefined8 local_68;
  TrackAllocData local_60;
  ScriptContext *local_38;
  ScriptContext *scriptContext_local;
  RecyclableObject *prototype_local;
  JsFinalizeCallback finalizeCallback_local;
  JsTraceCallback traceCallback_local;
  void *pvStack_10;
  uint inlineSlotSize_local;
  void *data_local;
  
  local_38 = scriptContext;
  scriptContext_local = (ScriptContext *)prototype;
  prototype_local = (RecyclableObject *)finalizeCallback;
  finalizeCallback_local = traceCallback;
  traceCallback_local._4_4_ = inlineSlotSize;
  pvStack_10 = data;
  if (prototype == (RecyclableObject *)0x0) {
    pJVar4 = Js::ScriptContext::GetLibrary(scriptContext);
    scriptContext_local =
         (ScriptContext *)
         Js::JavascriptLibraryBase::GetObjectPrototype(&pJVar4->super_JavascriptLibraryBase);
  }
  if (type == (JsrtExternalType *)0x0) {
    pJVar4 = Js::ScriptContext::GetLibrary(local_38);
    type = Js::JavascriptLibrary::GetCachedJsrtExternalType
                     (pJVar4,(uintptr_t)finalizeCallback_local,(uintptr_t)prototype_local,
                      (uintptr_t)scriptContext_local);
    if (type == (JsrtExternalType *)0x0) {
      pRVar5 = Js::ScriptContext::GetRecycler(local_38);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_60,(type_info *)&JsrtExternalType::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
                 ,0x5f);
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_60);
      externalObject = (JsrtExternalObject *)Memory::Recycler::AllocInlined;
      local_68 = 0;
      type = (JsrtExternalType *)new<Memory::Recycler>(0x48,pRVar5,0x43c4b0);
      JsrtExternalType::JsrtExternalType
                (type,local_38,finalizeCallback_local,(JsFinalizeCallback)prototype_local,
                 (RecyclableObject *)scriptContext_local);
      pJVar4 = Js::ScriptContext::GetLibrary(local_38);
      Js::JavascriptLibrary::CacheJsrtExternalType
                (pJVar4,(uintptr_t)finalizeCallback_local,(uintptr_t)prototype_local,
                 (uintptr_t)scriptContext_local,type);
    }
  }
  BVar3 = Js::Type::IsJsrtExternal((Type *)type);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
                       ,100,"(type->IsJsrtExternal())","type->IsJsrtExternal()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (finalizeCallback_local == (JsFinalizeCallback)0x0) {
    if (prototype_local == (RecyclableObject *)0x0) {
      pRVar5 = Js::ScriptContext::GetRecycler(local_38);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_110,(type_info *)&typeinfo,(ulong)traceCallback_local._4_4_,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
                 ,0x71);
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_110);
      pJVar7 = (JsrtExternalObject *)new<Memory::Recycler>(0x30,pRVar5,0x446fd0,0);
      JsrtExternalObject(pJVar7,type,pvStack_10,traceCallback_local._4_4_);
      local_78 = pJVar7;
    }
    else {
      pRVar5 = Js::ScriptContext::GetRecycler(local_38);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_d8,(type_info *)&typeinfo,(ulong)traceCallback_local._4_4_,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
                 ,0x6d);
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_d8);
      local_e8 = Memory::Recycler::AllocFinalized;
      local_e0 = 0;
      pJVar7 = (JsrtExternalObject *)new<Memory::Recycler>(0x30,pRVar5,0x48f150,0);
      JsrtExternalObject(pJVar7,type,pvStack_10,traceCallback_local._4_4_);
      local_78 = pJVar7;
    }
  }
  else {
    pRVar5 = Js::ScriptContext::GetRecycler(local_38);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_a0,(type_info *)&typeinfo,(ulong)traceCallback_local._4_4_,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
               ,0x69);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_a0);
    local_b0 = Memory::Recycler::AllocTracked;
    local_a8 = 0;
    pJVar7 = (JsrtExternalObject *)new<Memory::Recycler>(0x30,pRVar5,0x48f120,0);
    JsrtExternalObject(pJVar7,type,pvStack_10,traceCallback_local._4_4_);
    local_78 = pJVar7;
  }
  return local_78;
}

Assistant:

JsrtExternalObject* JsrtExternalObject::Create(void *data, uint inlineSlotSize, JsTraceCallback traceCallback, JsFinalizeCallback finalizeCallback, Js::RecyclableObject * prototype, Js::ScriptContext *scriptContext, JsrtExternalType * type)
{
    if (prototype == nullptr)
    {
        prototype = scriptContext->GetLibrary()->GetObjectPrototype();
    }
    if (type == nullptr)
    {
        type = scriptContext->GetLibrary()->GetCachedJsrtExternalType(reinterpret_cast<uintptr_t>(traceCallback), reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(prototype));

        if (type == nullptr)
        {
            type = RecyclerNew(scriptContext->GetRecycler(), JsrtExternalType, scriptContext, traceCallback, finalizeCallback, prototype);
            scriptContext->GetLibrary()->CacheJsrtExternalType(reinterpret_cast<uintptr_t>(traceCallback), reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(prototype), type);
        }
    }

    Assert(type->IsJsrtExternal());

    JsrtExternalObject * externalObject;
    if (traceCallback != nullptr)
    {
        externalObject = RecyclerNewTrackedPlus(scriptContext->GetRecycler(), inlineSlotSize, JsrtExternalObject, static_cast<JsrtExternalType*>(type), data, inlineSlotSize);
    }
    else if (finalizeCallback != nullptr) 
    {
        externalObject = RecyclerNewFinalizedPlus(scriptContext->GetRecycler(), inlineSlotSize, JsrtExternalObject, static_cast<JsrtExternalType*>(type), data, inlineSlotSize);
    }
    else
    {
        externalObject = RecyclerNewPlus(scriptContext->GetRecycler(), inlineSlotSize, JsrtExternalObject, static_cast<JsrtExternalType*>(type), data, inlineSlotSize);
    }

    return externalObject;
}